

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFmap.c
# Opt level: O1

NF_link_map * NF_map(NF_list *nl,int mode,void *addr)

{
  anon_union_8_2_f9000a74_for_d_un *paVar1;
  void *pvVar2;
  byte bVar3;
  ushort uVar4;
  Elf64_Word EVar5;
  uint uVar6;
  uint uVar7;
  Elf64_Xword EVar8;
  uint64_t uVar9;
  __off_t __offset;
  ulong uVar10;
  Elf64_Dyn *pEVar11;
  byte bVar12;
  long lVar13;
  int iVar14;
  Elf64_Phdr *__buf;
  Elf64_Phdr *pEVar15;
  long lVar16;
  ssize_t sVar17;
  uint *puVar18;
  Elf64_Dyn *pEVar19;
  NF_link_map *pNVar20;
  long lVar21;
  char *pcVar22;
  ulong uVar23;
  long lVar24;
  Elf64_Dyn **ppEVar25;
  void *__s;
  size_t sVar26;
  long *plVar27;
  void *pvVar28;
  long *plVar29;
  uint uVar30;
  void *pvVar31;
  long alStack_b0 [5];
  long alStack_88 [6];
  ulong uStack_58;
  NF_link_map *local_50;
  void *local_48;
  Elf64_Phdr *local_40;
  int local_38;
  uint local_34;
  
  pNVar20 = nl->map;
  sVar26 = pNVar20->l_phlen;
  alStack_88[5] = 0x103847;
  local_48 = addr;
  __buf = (Elf64_Phdr *)malloc(sVar26);
  alStack_88[5] = 0x10385e;
  pread(nl->fd,__buf,sVar26,pNVar20->l_phoff);
  uVar4 = pNVar20->l_phnum;
  lVar13 = -(ulong)((uint)uVar4 * 0x30);
  plVar29 = (long *)((long)&uStack_58 + lVar13);
  local_40 = __buf;
  if (uVar4 == 0) {
    local_34 = 0;
    uVar30 = 0;
  }
  else {
    pEVar15 = __buf + uVar4;
    uVar30 = 0;
    local_34 = 0;
    do {
      EVar5 = __buf->p_type;
      if (EVar5 == 6) {
        pNVar20->l_phdr = (Elf64_Phdr *)__buf->p_vaddr;
      }
      else if (EVar5 == 2) {
        pNVar20->l_ld = (Elf64_Dyn *)__buf->p_vaddr;
        pNVar20->l_ldnum = (uint16_t)((uint)__buf->p_memsz >> 4);
      }
      else if (EVar5 == 1) {
        lVar21 = (long)(int)uVar30;
        lVar24 = lVar21 * 0x30;
        uVar23 = __buf->p_vaddr;
        plVar29[lVar21 * 6] = uVar23 & 0xfffffffffffff000;
        EVar8 = __buf->p_filesz;
        *(Elf64_Xword *)((long)&local_50 + lVar24 + lVar13) =
             EVar8 + uVar23 + 0xfff & 0xfffffffffffff000;
        *(Elf64_Xword *)((long)&local_48 + lVar24 + lVar13) = EVar8 + uVar23;
        *(ulong *)((long)&local_40 + lVar24 + lVar13) = uVar23 + __buf->p_memsz;
        *(Elf64_Off *)((long)&local_38 + lVar24 + lVar13) = __buf->p_offset & 0xfffffffffffff000;
        if (0 < (int)uVar30) {
          local_34 = local_34 & 0xff;
          if (plVar29[lVar21 * 6 + -5] != (uVar23 & 0xfffffffffffff000)) {
            local_34 = 1;
          }
        }
        uVar30 = uVar30 + 1;
        *(undefined4 *)(plVar29 + lVar21 * 6 + 5) = 0;
        bVar3 = (byte)__buf->p_flags;
        bVar12 = bVar3 << 4;
        *(uint *)(plVar29 + lVar21 * 6 + 5) =
             (uint)((byte)((bVar12 | bVar3 >> 4) * '\x02' & 0x40 |
                          ((bVar12 & 0x10) << 2 | (bVar12 & 0x40) >> 2) * '\x02') >> 5);
      }
      __buf = __buf + 1;
    } while (__buf < pEVar15);
  }
  pvVar2 = local_48;
  if ((int)uVar30 < 2) {
    pcVar22 = "Wrong type of shared object or ELF: LOAD segment less than 2";
  }
  else {
    if (local_48 != (void *)0x0) {
      sVar26 = *(long *)((long)alStack_88 + (long)(int)uVar30 * 0x30 + lVar13 + 0x18) - *plVar29;
      local_38 = nl->fd;
      uVar6 = *(uint *)(&stack0xffffffffffffffd0 + lVar13);
      *(undefined8 *)((long)alStack_88 + lVar13 + 0x28) = 0x1039eb;
      iVar14 = mprotect(local_48,sVar26,uVar6 | 2);
      if (iVar14 == 0) {
        pNVar20->l_map_start = (uint64_t)pvVar2;
        pNVar20->l_map_end = sVar26 + (long)pvVar2;
        lVar21 = *plVar29;
        pNVar20->l_addr = (long)pvVar2 - lVar21;
        if ((local_34 & 1) != 0) {
          lVar16 = (ulong)uVar30 * 0x30;
          lVar24 = *(long *)((long)alStack_b0 + lVar16 + lVar13);
          lVar16 = *(long *)((long)alStack_88 + lVar16 + lVar13);
          *(undefined8 *)((long)alStack_88 + lVar13 + 0x28) = 0x103a2f;
          mprotect((void *)(((long)pvVar2 - lVar21) + lVar24),lVar16 - lVar24,0);
        }
        plVar27 = plVar29 + (ulong)uVar30 * 6;
        local_50 = pNVar20;
        do {
          lVar21 = *plVar29;
          lVar24 = plVar29[1];
          uVar9 = pNVar20->l_addr;
          __offset = plVar29[4];
          *(undefined8 *)((long)alStack_88 + lVar13 + 0x28) = 0x103a5a;
          sVar17 = pread(local_38,(void *)(uVar9 + lVar21),lVar24 - lVar21,__offset);
          if (sVar17 < 0) {
            pcVar22 = pNVar20->l_name;
            *(undefined8 *)((long)alStack_88 + lVar13 + 0x28) = 0x103c79;
            puVar18 = (uint *)__errno_location();
            uVar30 = *puVar18;
            *(undefined8 *)((long)alStack_88 + lVar13 + 0x28) = 0x103c8c;
            printf("error when reading library %s, and the errno is %d",pcVar22,(ulong)uVar30);
            goto LAB_00103c8c;
          }
          lVar21 = *plVar29;
          lVar24 = plVar29[1];
          uVar9 = pNVar20->l_addr;
          uVar30 = *(uint *)(plVar29 + 5);
          *(undefined8 *)((long)alStack_88 + lVar13 + 0x28) = 0x103a7f;
          mprotect((void *)(uVar9 + lVar21),lVar24 - lVar21,uVar30 | 2);
          if (pNVar20->l_phdr == (Elf64_Phdr *)0x0) {
            uVar23 = pNVar20->l_phoff;
            uVar10 = plVar29[4];
            if ((uVar10 <= uVar23) &&
               ((ulong)pNVar20->l_phnum * 0x38 + uVar23 <= (uVar10 + plVar29[1]) - *plVar29)) {
              pNVar20->l_phdr = (Elf64_Phdr *)((uVar23 - uVar10) + *plVar29);
            }
          }
          uVar23 = plVar29[2];
          if (uVar23 < (ulong)plVar29[3]) {
            uVar9 = pNVar20->l_addr;
            pvVar2 = (void *)(uVar9 + uVar23);
            pvVar31 = (void *)(plVar29[3] + uVar9);
            pvVar28 = (void *)(uVar9 + uVar23 + 0xfff & 0xfffffffffffff000);
            __s = pvVar28;
            if (pvVar31 < pvVar28) {
              __s = pvVar31;
            }
            if (pvVar2 <= __s && (long)__s - (long)pvVar2 != 0) {
              *(undefined8 *)((long)alStack_88 + lVar13 + 0x28) = 0x103aff;
              memset(pvVar2,0,(long)__s - (long)pvVar2);
            }
            pNVar20 = local_50;
            if (pvVar28 < pvVar31) {
              *(undefined8 *)((long)alStack_88 + lVar13 + 0x28) = 0x103b29;
              memset(__s,0,((long)pvVar31 + 0xfffU & 0xfffffffffffff000) - (long)__s);
            }
          }
          plVar29 = plVar29 + 6;
        } while (plVar29 < plVar27);
        if (pNVar20->l_phdr == (Elf64_Phdr *)0x0) {
          pNVar20->l_phdr = local_40;
        }
        uVar9 = pNVar20->l_addr;
        pEVar11 = pNVar20->l_ld;
        pNVar20->l_phdr = (Elf64_Phdr *)((long)&pNVar20->l_phdr->p_type + uVar9);
        pEVar19 = (Elf64_Dyn *)((long)&pEVar11->d_tag + uVar9);
        pNVar20->l_ld = pEVar19;
        uVar23 = *(ulong *)((long)&pEVar11->d_tag + uVar9);
        if (uVar23 != 0) {
          do {
            if (uVar23 < 0x23) {
              ppEVar25 = pNVar20->l_info + uVar23;
LAB_00103b97:
              *ppEVar25 = pEVar19;
            }
            else {
              ppEVar25 = pNVar20->l_info + 0x22;
              if ((uVar23 == 0x6ffffff9) ||
                 (ppEVar25 = pNVar20->l_info + 0x23, uVar23 == 0x6ffffef5)) goto LAB_00103b97;
            }
            uVar23 = pEVar19[1].d_tag;
            pEVar19 = pEVar19 + 1;
          } while (uVar23 != 0);
        }
        if (pNVar20->l_info[6] != (Elf64_Dyn *)0x0) {
          paVar1 = &pNVar20->l_info[6]->d_un;
          paVar1->d_val = paVar1->d_val + uVar9;
        }
        if (pNVar20->l_info[5] != (Elf64_Dyn *)0x0) {
          paVar1 = &pNVar20->l_info[5]->d_un;
          paVar1->d_val = paVar1->d_val + pNVar20->l_addr;
        }
        if (pNVar20->l_info[7] != (Elf64_Dyn *)0x0) {
          paVar1 = &pNVar20->l_info[7]->d_un;
          paVar1->d_val = paVar1->d_val + pNVar20->l_addr;
        }
        if (pNVar20->l_info[0x17] != (Elf64_Dyn *)0x0) {
          paVar1 = &pNVar20->l_info[0x17]->d_un;
          paVar1->d_val = paVar1->d_val + pNVar20->l_addr;
        }
        if (pNVar20->l_info[0x23] != (Elf64_Dyn *)0x0) {
          paVar1 = &pNVar20->l_info[0x23]->d_un;
          paVar1->d_val = paVar1->d_val + pNVar20->l_addr;
        }
        puVar18 = (uint *)(pNVar20->l_info[0x23]->d_un).d_val;
        uVar30 = *puVar18;
        pNVar20->l_nbuckets = uVar30;
        uVar6 = puVar18[1];
        uVar7 = puVar18[2];
        pNVar20->l_gnu_bitmask_idxbits = uVar7 - 1;
        pNVar20->l_gnu_shift = puVar18[3];
        pNVar20->l_gnu_bitmask = (Elf64_Addr *)(puVar18 + 4);
        pNVar20->l_gnu_buckets = puVar18 + (ulong)(uVar7 * 2) + 4;
        pNVar20->l_gnu_chain_zero =
             puVar18 + (ulong)(uVar7 * 2) + 4 + ((ulong)uVar30 - (ulong)uVar6);
        return pNVar20;
      }
      *(undefined8 *)((long)alStack_88 + lVar13 + 0x28) = 0x103cb2;
      puVar18 = (uint *)__errno_location();
      uVar30 = *puVar18;
      *(undefined8 *)((long)alStack_88 + lVar13 + 0x28) = 0x103cc2;
      printf("error when calling mprotect, and the error code is %d\n",(ulong)uVar30);
      goto LAB_00103c8c;
    }
    pcVar22 = "please map the so in a malloc\'d region";
  }
  *(undefined8 *)((long)alStack_88 + lVar13 + 0x28) = 0x103cab;
  puts(pcVar22);
LAB_00103c8c:
  *(undefined8 *)((long)alStack_88 + lVar13 + 0x28) = 0x103c96;
  exit(-1);
}

Assistant:

struct NF_link_map *NF_map(struct NF_list *nl, int mode, void *addr)
{
    //int fd;

    /* TODO: actually serach directories here */
    //fd = open(file, O_RDONLY, 0);
    /* it may help to know the SONAME and REALNAME of a so */

    //struct filebuf fb;

    /* just cram into buf as much as you can */
    /* use a do-while can assure this event won't be interrupted */
    //size_t retlen = read(fd, fb.buf, sizeof(fb.buf) - fb.len);

    /* the information we get from ehdr is merely phnum, total length of all program headers, and offset for program headers
     * so we dump filebuf in NF_list, instead it is added as NF_link_map members
     * also ``Elf64_Addr`` is always sufficient for ``maplength``, for it is a memory length
     */
    //Elf64_Ehdr *ehdr = (Elf64_Ehdr *)nl->fb.buf;
    //size_t maplength = ehdr->e_phnum * sizeof(Elf64_Phdr);

    /* create a new link map, and fill in header table info */
    //struct NF_link_map *l = calloc(sizeof(struct NF_link_map), 1);
    //l->l_phnum = ehdr->e_phnum;

    /* note that in dl-load: open_verify 
     * That function open an file with a little bit check to the phdrs
     * And the same thing just appear once again in _dl_map_object_from_fd
     */
    /* store the phdrs on heap for further loading */
    //Elf64_Phdr *phdr = malloc(maplength);
    //pread(nl->fd, (void *)phdr, maplength, ehdr->e_phoff);

    struct NF_link_map *l = nl->map;
    Elf64_Phdr *phdr = malloc(l->l_phlen);
    pread(nl->fd, (void *)phdr, l->l_phlen, l->l_phoff);

    struct loadcmd loadcmds[l->l_phnum];
    int nloadcmds = 0;
    bool has_holes = false;

    Elf64_Phdr *ph;
    /* travese the segments! */
    for (ph = phdr; ph < &phdr[l->l_phnum]; ++ph)
    {
        switch (ph->p_type)
        {
        case PT_LOAD:
        {
            /* load and add it to loadcmds */
            struct loadcmd *c = &loadcmds[nloadcmds++]; //get the current loaction in loadcmds
            /* TODO: pagesize are set to 4096 for simplicity */
            c->mapstart = ALIGN_DOWN(ph->p_vaddr, 4096);
            c->mapend = ALIGN_UP(ph->p_vaddr + ph->p_filesz, 4096);
            c->dataend = ph->p_vaddr + ph->p_filesz;
            c->allocend = ph->p_vaddr + ph->p_memsz;
            c->mapoff = ALIGN_DOWN(ph->p_offset, 4096);

            /* hey ELF, is it your last segment? */
            if (nloadcmds > 1 && c[-1].mapend != c->mapstart)
                has_holes = true;

            /* setting the protection of this segment. may have errors */
            c->prot = 0;
            c->prot |= (ph->p_flags & PF_R) >> 2;
            c->prot |= ph->p_flags & PF_W;
            c->prot |= (ph->p_flags & PF_X) << 2;

            break;
        }
        case PT_PHDR:
            /* the PHT itself, usually the first one */
            /* or it may not exist at all, in which case it says "use ld.so to find it in a LOAD segment" */
            l->l_phdr = (void *)ph->p_vaddr;
            break;

        case PT_DYNAMIC:
            /* the dynamic section */
            l->l_ld = (void *)ph->p_vaddr;
            l->l_ldnum = ph->p_memsz / sizeof(Elf64_Dyn);
            break;

        default:
            break;
        }
    }

    /* now map LOAD segments into memory */
    size_t maplength = loadcmds[nloadcmds - 1].allocend - loadcmds[0].mapstart;
    map_segments(l, addr, loadcmds, nloadcmds, has_holes, nl->fd, maplength);

    if (l->l_phdr == NULL)
        /* This is expected. I don't know why l_phdr is not allocated 
     * It's probably because of capatiabilty issue, sigh
     */
        l->l_phdr = phdr;

    /* After loading, the absolute address is set, now relocate the PHT */
    l->l_phdr = (Elf64_Phdr *)((Elf64_Addr)l->l_phdr + l->l_addr);

    /* rebasing ld to prevent SIGSEGV */
    l->l_ld = (Elf64_Dyn *)((Elf64_Addr)l->l_ld + l->l_addr);
    /* indexing the l_ld into l_info */
    fill_info(l);

    setup_hash(l);

    return l;
}